

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O0

ALCchar * DevFmtChannelsString(DevFmtChannels chans)

{
  DevFmtChannels chans_local;
  char *local_8;
  
  switch(chans) {
  case DevFmtMono:
    local_8 = "Mono";
    break;
  case DevFmtChannelsDefault:
    local_8 = "Stereo";
    break;
  case DevFmtQuad:
    local_8 = "Quadraphonic";
    break;
  case DevFmtX51:
    local_8 = "5.1 Surround";
    break;
  case DevFmtX61:
    local_8 = "6.1 Surround";
    break;
  case DevFmtX71:
    local_8 = "7.1 Surround";
    break;
  case DevFmtAmbi3D:
    local_8 = "Ambisonic 3D";
    break;
  case DevFmtX51Rear:
    local_8 = "5.1 Surround (Rear)";
    break;
  default:
    local_8 = "(unknown channels)";
  }
  return local_8;
}

Assistant:

const ALCchar *DevFmtChannelsString(DevFmtChannels chans) noexcept
{
    switch(chans)
    {
    case DevFmtMono: return "Mono";
    case DevFmtStereo: return "Stereo";
    case DevFmtQuad: return "Quadraphonic";
    case DevFmtX51: return "5.1 Surround";
    case DevFmtX51Rear: return "5.1 Surround (Rear)";
    case DevFmtX61: return "6.1 Surround";
    case DevFmtX71: return "7.1 Surround";
    case DevFmtAmbi3D: return "Ambisonic 3D";
    }
    return "(unknown channels)";
}